

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O2

int rsa_rsassa_pkcs1_v15_encode
              (mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,size_t dst_len,uchar *dst)

{
  uchar *__s;
  uchar *__dest;
  uchar uVar1;
  size_t sVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ulong __n;
  char *oid;
  size_t oid_size;
  char *local_48;
  size_t local_40;
  size_t local_38;
  
  local_40 = 0;
  local_48 = (char *)0x0;
  __n = (ulong)hashlen;
  if (md_alg == MBEDTLS_MD_NONE) {
    uVar5 = __n;
    if (dst_len < __n) {
      return -0x4080;
    }
  }
  else {
    bVar3 = mbedtls_md_get_size_from_type(md_alg);
    if (bVar3 == 0) {
      return -0x4080;
    }
    iVar4 = mbedtls_oid_get_oid_by_md(md_alg,&local_48,&local_40);
    if (bVar3 != hashlen) {
      return -0x4080;
    }
    if (iVar4 != 0) {
      return -0x4080;
    }
    if (0x7f < __n + local_40 + 8) {
      return -0x4080;
    }
    uVar5 = local_40 + __n + 10;
    if (uVar5 < __n + 10 || dst_len < uVar5) {
      return -0x4080;
    }
  }
  uVar5 = dst_len - uVar5;
  iVar4 = -0x4080;
  if (10 < uVar5) {
    dst[0] = '\0';
    dst[1] = '\x01';
    __s = dst + 2;
    local_38 = local_40;
    switchD_016d4fed::default(__s,0xff,uVar5 - 3);
    sVar2 = local_38;
    dst[uVar5 - 1] = '\0';
    if (md_alg == MBEDTLS_MD_NONE) {
      switchD_016b0717::default(dst + uVar5,hash,__n);
    }
    else {
      dst[uVar5] = '0';
      uVar1 = (uchar)local_38;
      dst[uVar5 + 1] = uVar1 + (uchar)hashlen + '\b';
      dst[uVar5 + 2] = '0';
      dst[uVar5 + 3] = uVar1 + '\x04';
      dst[uVar5 + 4] = '\x06';
      dst[uVar5 + 5] = uVar1;
      switchD_016b0717::default(__s + uVar5 + 4,local_48,local_38);
      __dest = __s + sVar2 + 8 + uVar5;
      __dest[-4] = '\x05';
      __dest[-3] = '\0';
      __dest[-2] = '\x04';
      __dest[-1] = (uchar)hashlen;
      switchD_016b0717::default(__dest,hash,__n);
      if (__s + __n + sVar2 + uVar5 + 8 != dst + dst_len) {
        mbedtls_platform_zeroize(dst,dst_len);
        return -0x4080;
      }
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int rsa_rsassa_pkcs1_v15_encode(mbedtls_md_type_t md_alg,
                                       unsigned int hashlen,
                                       const unsigned char *hash,
                                       size_t dst_len,
                                       unsigned char *dst)
{
    size_t oid_size  = 0;
    size_t nb_pad    = dst_len;
    unsigned char *p = dst;
    const char *oid  = NULL;

    /* Are we signing hashed or raw data? */
    if (md_alg != MBEDTLS_MD_NONE) {
        unsigned char md_size = mbedtls_md_get_size_from_type(md_alg);
        if (md_size == 0) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

        if (mbedtls_oid_get_oid_by_md(md_alg, &oid, &oid_size) != 0) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

        if (hashlen != md_size) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

        /* Double-check that 8 + hashlen + oid_size can be used as a
         * 1-byte ASN.1 length encoding and that there's no overflow. */
        if (8 + hashlen + oid_size  >= 0x80         ||
            10 + hashlen            <  hashlen      ||
            10 + hashlen + oid_size <  10 + hashlen) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

        /*
         * Static bounds check:
         * - Need 10 bytes for five tag-length pairs.
         *   (Insist on 1-byte length encodings to protect against variants of
         *    Bleichenbacher's forgery attack against lax PKCS#1v1.5 verification)
         * - Need hashlen bytes for hash
         * - Need oid_size bytes for hash alg OID.
         */
        if (nb_pad < 10 + hashlen + oid_size) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }
        nb_pad -= 10 + hashlen + oid_size;
    } else {
        if (nb_pad < hashlen) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

        nb_pad -= hashlen;
    }

    /* Need space for signature header and padding delimiter (3 bytes),
     * and 8 bytes for the minimal padding */
    if (nb_pad < 3 + 8) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }
    nb_pad -= 3;

    /* Now nb_pad is the amount of memory to be filled
     * with padding, and at least 8 bytes long. */

    /* Write signature header and padding */
    *p++ = 0;
    *p++ = MBEDTLS_RSA_SIGN;
    memset(p, 0xFF, nb_pad);
    p += nb_pad;
    *p++ = 0;

    /* Are we signing raw data? */
    if (md_alg == MBEDTLS_MD_NONE) {
        memcpy(p, hash, hashlen);
        return 0;
    }

    /* Signing hashed data, add corresponding ASN.1 structure
     *
     * DigestInfo ::= SEQUENCE {
     *   digestAlgorithm DigestAlgorithmIdentifier,
     *   digest Digest }
     * DigestAlgorithmIdentifier ::= AlgorithmIdentifier
     * Digest ::= OCTET STRING
     *
     * Schematic:
     * TAG-SEQ + LEN [ TAG-SEQ + LEN [ TAG-OID  + LEN [ OID  ]
     *                                 TAG-NULL + LEN [ NULL ] ]
     *                 TAG-OCTET + LEN [ HASH ] ]
     */
    *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
    *p++ = (unsigned char) (0x08 + oid_size + hashlen);
    *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
    *p++ = (unsigned char) (0x04 + oid_size);
    *p++ = MBEDTLS_ASN1_OID;
    *p++ = (unsigned char) oid_size;
    memcpy(p, oid, oid_size);
    p += oid_size;
    *p++ = MBEDTLS_ASN1_NULL;
    *p++ = 0x00;
    *p++ = MBEDTLS_ASN1_OCTET_STRING;
    *p++ = (unsigned char) hashlen;
    memcpy(p, hash, hashlen);
    p += hashlen;

    /* Just a sanity-check, should be automatic
     * after the initial bounds check. */
    if (p != dst + dst_len) {
        mbedtls_platform_zeroize(dst, dst_len);
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    return 0;
}